

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenio::save_faces2smesh(tetgenio *this,char *filebasename)

{
  int *piVar1;
  FILE *__stream;
  long lVar2;
  long lVar3;
  char outsmeshfilename [1024];
  
  sprintf(outsmeshfilename,"%s.smesh",filebasename);
  printf("Saving faces to %s\n",outsmeshfilename);
  __stream = fopen(outsmeshfilename,"w");
  fprintf(__stream,"%d  %d  %d  %d\n",0,(ulong)(uint)this->mesh_dim,
          (ulong)(uint)this->numberofpointattributes,(ulong)(this->pointmarkerlist != (int *)0x0));
  fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberoftrifaces,
          (ulong)(this->trifacemarkerlist != (int *)0x0));
  lVar3 = 2;
  for (lVar2 = 0; lVar2 < this->numberoftrifaces; lVar2 = lVar2 + 1) {
    piVar1 = this->trifacelist;
    fprintf(__stream,"3  %d %d %d",(ulong)(uint)piVar1[lVar3 + -2],(ulong)(uint)piVar1[lVar3 + -1],
            (ulong)(uint)piVar1[lVar3]);
    if (this->trifacemarkerlist != (int *)0x0) {
      fprintf(__stream,"  %d",(ulong)(uint)this->trifacemarkerlist[lVar2]);
    }
    fputc(10,__stream);
    lVar3 = lVar3 + 3;
  }
  fwrite("0\n",2,1,__stream);
  fwrite("0\n",2,1,__stream);
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_faces2smesh(char* filebasename)
{
  FILE *fout;
  char outsmeshfilename[FILENAMESIZE];
  int i, j;

  sprintf(outsmeshfilename, "%s.smesh", filebasename);
  printf("Saving faces to %s\n", outsmeshfilename);
  fout = fopen(outsmeshfilename, "w");

  // The zero indicates that the vertices are in a separate .node file.
  //   Followed by number of dimensions, number of vertex attributes,
  //   and number of boundary markers (zero or one).
  fprintf(fout, "%d  %d  %d  %d\n", 0, mesh_dim, numberofpointattributes,
          pointmarkerlist != NULL ? 1 : 0);

  // Number of facets, number of boundary markers (zero or one).
  fprintf(fout, "%d  %d\n", numberoftrifaces, 
          trifacemarkerlist != NULL ? 1 : 0);

  // Output triangular facets.
  for (i = 0; i < numberoftrifaces; i++) {
    j = i * 3;
    fprintf(fout, "3  %d %d %d", trifacelist[j], trifacelist[j + 1], 
            trifacelist[j + 2]);
    if (trifacemarkerlist != NULL) {
      fprintf(fout, "  %d", trifacemarkerlist[i]);
    }
    fprintf(fout, "\n");
  }

  // No holes and regions.
  fprintf(fout, "0\n");
  fprintf(fout, "0\n");

  fclose(fout);  
}